

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O3

int xmlStreamPushInternal(xmlStreamCtxtPtr stream,xmlChar *name,xmlChar *ns,int nodeType)

{
  uint uVar1;
  int iVar2;
  xmlStreamCompPtr pxVar3;
  int *piVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  xmlStreamStepPtr pxVar11;
  uint uVar12;
  int iVar13;
  xmlStreamCtxtPtr comp;
  int iVar14;
  bool bVar15;
  uint local_70;
  
  if (stream == (xmlStreamCtxtPtr)0x0) {
    return -1;
  }
  if (stream->nbState < 0) {
    return -1;
  }
  uVar12 = 0;
  local_70 = 0;
  comp = stream;
LAB_0017068a:
  do {
    pxVar3 = stream->comp;
    if (ns == (xmlChar *)0x0 && (name == (xmlChar *)0x0 && nodeType == 1)) {
      comp->nbState = 0;
      comp->level = 0;
      comp->blockLevel = -1;
      uVar8 = uVar12;
      if ((pxVar3->flags & 0x8000) != 0) {
        uVar8 = 1;
        if (pxVar3->nbStep != 0) {
          if (pxVar3->nbStep == 1) {
            pxVar11 = pxVar3->steps;
            if ((pxVar11->nodeType == 100) && ((pxVar11->flags & 1) != 0)) goto LAB_001709f6;
          }
          else {
            pxVar11 = pxVar3->steps;
          }
          uVar8 = uVar12;
          if (((pxVar11->flags & 4) != 0) && (iVar10 = xmlStreamCtxtAddState(comp,0,0), iVar10 < 0))
          {
            return -1;
          }
        }
      }
LAB_001709f6:
      uVar12 = uVar8;
      stream = comp->next;
    }
    else {
      if (pxVar3->nbStep == 0) {
        if ((stream->flags & 1U) != 0) {
          stream = stream->next;
          if (stream == (_xmlStreamCtxt *)0x0) {
            return uVar12;
          }
          goto LAB_0017068a;
        }
        if ((nodeType != 2) && (((stream->flags & 6U) == 0 || (stream->level == 0)))) {
          uVar12 = 1;
        }
LAB_001709de:
        stream->level = stream->level + 1;
      }
      else {
        if ((stream->blockLevel != -1) ||
           ((nodeType - 3U < 0xfffffffe && ((pxVar3->flags & 0x4000) == 0)))) goto LAB_001709de;
        iVar10 = stream->nbState;
        if (0 < iVar10) {
          uVar8 = pxVar3->flags;
          iVar14 = 0;
          do {
            piVar4 = stream->states;
            if ((uVar8 >> 0x10 & 1) == 0) {
              iVar9 = stream->level;
              if (piVar4[stream->nbState * 2 + -1] < iVar9) {
                return -1;
              }
              iVar13 = piVar4[stream->nbState * 2 + -2];
              pxVar11 = pxVar3->steps;
              iVar14 = iVar10;
LAB_0017078e:
              uVar1 = pxVar11[iVar13].flags;
              iVar2 = pxVar11[iVar13].nodeType;
              if (iVar2 == nodeType) {
                if (nodeType == 100) {
LAB_001708f9:
                  local_70 = uVar1 & 2;
                  if (local_70 == 0) {
                    iVar9 = xmlStreamCtxtAddState(stream,iVar13 + 1,stream->level + 1);
                    if (iVar9 < 0) {
                      return -1;
                    }
                    bVar7 = 0;
                    local_70 = 0;
                    bVar15 = uVar12 != 1;
                    uVar12 = 1;
                    if (bVar15) {
                      bVar7 = 0;
                      uVar12 = uVar1 >> 5 & 1;
                    }
                  }
                  else {
                    bVar7 = 0;
                    uVar12 = 1;
                  }
                }
                else {
                  pxVar5 = pxVar11[iVar13].name;
                  pxVar6 = pxVar11[iVar13].ns;
                  if (pxVar5 == (xmlChar *)0x0) {
                    if (pxVar6 != (xmlChar *)0x0) {
                      if (ns == (xmlChar *)0x0) goto LAB_00170965;
                      iVar9 = xmlStrEqual(pxVar6,ns);
LAB_001708f0:
                      if (iVar9 == 0) {
LAB_00170987:
                        bVar7 = 1;
                        goto LAB_00170989;
                      }
                    }
                    goto LAB_001708f9;
                  }
                  bVar7 = 1;
                  if (name == (xmlChar *)0x0) {
LAB_00170965:
                    bVar7 = 1;
                  }
                  else if (((ns == (xmlChar *)0x0) != (pxVar6 != (xmlChar *)0x0)) &&
                          (*pxVar5 == *name)) {
                    iVar9 = xmlStrEqual(pxVar5,name);
                    if (iVar9 == 0) goto LAB_00170987;
                    if (pxVar6 != ns) {
                      iVar9 = xmlStrEqual(pxVar6,ns);
                      goto LAB_001708f0;
                    }
                    goto LAB_001708f9;
                  }
                }
LAB_00170989:
                uVar8 = pxVar3->flags;
                if ((uVar8 >> 0x10 & 1) == 0) {
                  if ((bool)(bVar7 | local_70 != 0)) {
                    iVar9 = stream->level;
                    goto LAB_001709a6;
                  }
                  local_70 = 0;
                }
              }
              else {
                if (iVar2 == 100) goto LAB_001708f9;
                if ((iVar2 != 2) || ((uVar8 >> 0x10 & 1) != 0)) goto LAB_001709b4;
LAB_001709a6:
                stream->blockLevel = iVar9 + 1;
              }
            }
            else {
              iVar13 = piVar4[(uint)(iVar14 * 2)];
              if (-1 < (long)iVar13) {
                iVar9 = stream->level;
                if ((piVar4[(ulong)(uint)(iVar14 * 2) + 1] <= iVar9) &&
                   ((pxVar11 = pxVar3->steps, iVar9 <= piVar4[(ulong)(uint)(iVar14 * 2) + 1] ||
                    ((pxVar11[iVar13].flags & 1U) != 0)))) goto LAB_0017078e;
              }
            }
LAB_001709b4:
            iVar14 = iVar14 + 1;
          } while (iVar14 < iVar10);
        }
        iVar10 = stream->level;
        iVar14 = iVar10 + 1;
        stream->level = iVar14;
        pxVar11 = pxVar3->steps;
        uVar8 = pxVar11->flags;
        if ((uVar8 & 4) != 0) goto LAB_001709e3;
        pxVar5 = pxVar11->name;
        pxVar6 = pxVar11->ns;
        uVar1 = stream->flags;
        if ((uVar1 & 7) == 0) {
LAB_00170abb:
          if (pxVar11->nodeType == nodeType) {
            if (nodeType == 100) {
LAB_00170b6a:
              local_70 = uVar8 & 2;
              if (local_70 == 0) {
                iVar10 = xmlStreamCtxtAddState(stream,1,stream->level);
                if (iVar10 < 0) {
                  return -1;
                }
                local_70 = 0;
                bVar7 = 0;
                bVar15 = uVar12 != 1;
                uVar12 = 1;
                if (bVar15) {
                  uVar12 = uVar8 >> 5 & 1;
                  local_70 = 0;
                  bVar7 = 0;
                }
              }
              else {
                bVar7 = 0;
                uVar12 = 1;
              }
            }
            else {
              if (pxVar5 == (xmlChar *)0x0) {
                if (pxVar6 != (xmlChar *)0x0) {
                  if (ns == (xmlChar *)0x0) goto LAB_00170c24;
                  iVar10 = xmlStrEqual(pxVar6,ns);
                  local_70 = uVar8 & 2;
                  if (iVar10 == 0) {
                    bVar7 = 1;
                    goto LAB_00170c2b;
                  }
                }
                goto LAB_00170b6a;
              }
              if (((((name != (xmlChar *)0x0) &&
                    ((ns == (xmlChar *)0x0) != (pxVar6 != (xmlChar *)0x0))) && (*pxVar5 == *name))
                  && (iVar10 = xmlStrEqual(pxVar5,name), iVar10 != 0)) &&
                 ((pxVar6 == ns || (iVar10 = xmlStrEqual(pxVar6,ns), iVar10 != 0))))
              goto LAB_00170b6a;
LAB_00170c24:
              local_70 = uVar8 & 2;
              bVar7 = 1;
            }
LAB_00170c2b:
            if ((pxVar3->flags & 0x10000) == 0) {
              if ((bool)(~bVar7 & local_70 == 0)) {
                local_70 = 0;
              }
              else {
                stream->blockLevel = stream->level;
              }
            }
          }
          else if ((nodeType != 2) && (pxVar11->nodeType == 100)) goto LAB_00170b6a;
        }
        else if (iVar10 == 0) {
          if ((uVar1 & 6) == 0) goto LAB_00170abb;
        }
        else if (((uVar8 & 1) != 0) || ((uVar1 & 6) != 0 && iVar14 == 2)) goto LAB_00170abb;
      }
LAB_001709e3:
      stream = stream->next;
    }
    comp = stream;
    if (stream == (_xmlStreamCtxt *)0x0) {
      return uVar12;
    }
  } while( true );
}

Assistant:

static int
xmlStreamPushInternal(xmlStreamCtxtPtr stream,
		      const xmlChar *name, const xmlChar *ns,
		      int nodeType) {
    int ret = 0, final = 0, tmp, i, m, match, stepNr, desc;
    xmlStreamCompPtr comp;
    xmlStreamStep step;

    if ((stream == NULL) || (stream->nbState < 0))
        return(-1);

    while (stream != NULL) {
	comp = stream->comp;

	if ((nodeType == XML_ELEMENT_NODE) &&
	    (name == NULL) && (ns == NULL)) {
	    /* We have a document node here (or a reset). */
	    stream->nbState = 0;
	    stream->level = 0;
	    stream->blockLevel = -1;
	    if (comp->flags & XML_STREAM_FROM_ROOT) {
		if (comp->nbStep == 0) {
		    /* TODO: We have a "/." here? */
		    ret = 1;
		} else {
		    if ((comp->nbStep == 1) &&
			(comp->steps[0].nodeType == XML_STREAM_ANY_NODE) &&
			(comp->steps[0].flags & XML_STREAM_STEP_DESC))
		    {
			/*
			* In the case of "//." the document node will match
			* as well.
			*/
			ret = 1;
		    } else if (comp->steps[0].flags & XML_STREAM_STEP_ROOT) {
			if (xmlStreamCtxtAddState(stream, 0, 0) < 0)
                            return(-1);
		    }
		}
	    }
	    stream = stream->next;
	    continue; /* while */
	}

	/*
	* Fast check for ".".
	*/
	if (comp->nbStep == 0) {
	    /*
	     * / and . are handled at the XPath node set creation
	     * level by checking min depth
	     */
	    if (stream->flags & XML_PATTERN_XPATH) {
		stream = stream->next;
		continue; /* while */
	    }
	    /*
	    * For non-pattern like evaluation like XML Schema IDCs
	    * or traditional XPath expressions, this will match if
	    * we are at the first level only, otherwise on every level.
	    */
	    if ((nodeType != XML_ATTRIBUTE_NODE) &&
		(((stream->flags & XML_PATTERN_NOTPATTERN) == 0) ||
		(stream->level == 0))) {
		    ret = 1;
	    }
	    stream->level++;
	    goto stream_next;
	}
	if (stream->blockLevel != -1) {
	    /*
	    * Skip blocked expressions.
	    */
	    stream->level++;
	    goto stream_next;
	}

	if ((nodeType != XML_ELEMENT_NODE) &&
	    (nodeType != XML_ATTRIBUTE_NODE) &&
	    ((comp->flags & XML_STREAM_FINAL_IS_ANY_NODE) == 0)) {
	    /*
	    * No need to process nodes of other types if we don't
	    * resolve to those types.
	    * TODO: Do we need to block the context here?
	    */
	    stream->level++;
	    goto stream_next;
	}

	/*
	 * Check evolution of existing states
	 */
	i = 0;
	m = stream->nbState;
	while (i < m) {
	    if ((comp->flags & XML_STREAM_DESC) == 0) {
		/*
		* If there is no "//", then only the last
		* added state is of interest.
		*/
		stepNr = stream->states[2 * (stream->nbState -1)];
		/*
		* TODO: Security check, should not happen, remove it.
		*/
		if (stream->states[(2 * (stream->nbState -1)) + 1] <
		    stream->level) {
		    return (-1);
		}
		desc = 0;
		/* loop-stopper */
		i = m;
	    } else {
		/*
		* If there are "//", then we need to process every "//"
		* occurring in the states, plus any other state for this
		* level.
		*/
		stepNr = stream->states[2 * i];

		/* TODO: should not happen anymore: dead states */
		if (stepNr < 0)
		    goto next_state;

		tmp = stream->states[(2 * i) + 1];

		/* skip new states just added */
		if (tmp > stream->level)
		    goto next_state;

		/* skip states at ancestor levels, except if "//" */
		desc = comp->steps[stepNr].flags & XML_STREAM_STEP_DESC;
		if ((tmp < stream->level) && (!desc))
		    goto next_state;
	    }
	    /*
	    * Check for correct node-type.
	    */
	    step = comp->steps[stepNr];
	    if (step.nodeType != nodeType) {
		if (step.nodeType == XML_ATTRIBUTE_NODE) {
		    /*
		    * Block this expression for deeper evaluation.
		    */
		    if ((comp->flags & XML_STREAM_DESC) == 0)
			stream->blockLevel = stream->level +1;
		    goto next_state;
		} else if (step.nodeType != XML_STREAM_ANY_NODE)
		    goto next_state;
	    }
	    /*
	    * Compare local/namespace-name.
	    */
	    match = 0;
	    if (step.nodeType == XML_STREAM_ANY_NODE) {
		match = 1;
	    } else if (step.name == NULL) {
		if (step.ns == NULL) {
		    /*
		    * This lets through all elements/attributes.
		    */
		    match = 1;
		} else if (ns != NULL)
		    match = xmlStrEqual(step.ns, ns);
	    } else if (((step.ns != NULL) == (ns != NULL)) &&
		(name != NULL) &&
		(step.name[0] == name[0]) &&
		xmlStrEqual(step.name, name) &&
		((step.ns == ns) || xmlStrEqual(step.ns, ns)))
	    {
		match = 1;
	    }
	    if (match) {
		final = step.flags & XML_STREAM_STEP_FINAL;
                if (final) {
                    ret = 1;
                } else if (xmlStreamCtxtAddState(stream, stepNr + 1,
                                                 stream->level + 1) < 0) {
                    return(-1);
                }
		if ((ret != 1) && (step.flags & XML_STREAM_STEP_IN_SET)) {
		    /*
		    * Check if we have a special case like "foo/bar//.", where
		    * "foo" is selected as well.
		    */
		    ret = 1;
		}
	    }
	    if (((comp->flags & XML_STREAM_DESC) == 0) &&
		((! match) || final))  {
		/*
		* Mark this expression as blocked for any evaluation at
		* deeper levels. Note that this includes "/foo"
		* expressions if the *pattern* behaviour is used.
		*/
		stream->blockLevel = stream->level +1;
	    }
next_state:
	    i++;
	}

	stream->level++;

	/*
	* Re/enter the expression.
	* Don't reenter if it's an absolute expression like "/foo",
	*   except "//foo".
	*/
	step = comp->steps[0];
	if (step.flags & XML_STREAM_STEP_ROOT)
	    goto stream_next;

	desc = step.flags & XML_STREAM_STEP_DESC;
	if (stream->flags & XML_PATTERN_NOTPATTERN) {
	    /*
	    * Re/enter the expression if it is a "descendant" one,
	    * or if we are at the 1st level of evaluation.
	    */

	    if (stream->level == 1) {
		if (XML_STREAM_XS_IDC(stream)) {
		    /*
		    * XS-IDC: The missing "self::node()" will always
		    * match the first given node.
		    */
		    goto stream_next;
		} else
		    goto compare;
	    }
	    /*
	    * A "//" is always reentrant.
	    */
	    if (desc)
		goto compare;

	    /*
	    * XS-IDC: Process the 2nd level, since the missing
	    * "self::node()" is responsible for the 2nd level being
	    * the real start level.
	    */
	    if ((stream->level == 2) && XML_STREAM_XS_IDC(stream))
		goto compare;

	    goto stream_next;
	}

compare:
	/*
	* Check expected node-type.
	*/
	if (step.nodeType != nodeType) {
	    if (nodeType == XML_ATTRIBUTE_NODE)
		goto stream_next;
	    else if (step.nodeType != XML_STREAM_ANY_NODE)
		goto stream_next;
	}
	/*
	* Compare local/namespace-name.
	*/
	match = 0;
	if (step.nodeType == XML_STREAM_ANY_NODE) {
	    match = 1;
	} else if (step.name == NULL) {
	    if (step.ns == NULL) {
		/*
		* This lets through all elements/attributes.
		*/
		match = 1;
	    } else if (ns != NULL)
		match = xmlStrEqual(step.ns, ns);
	} else if (((step.ns != NULL) == (ns != NULL)) &&
	    (name != NULL) &&
	    (step.name[0] == name[0]) &&
	    xmlStrEqual(step.name, name) &&
	    ((step.ns == ns) || xmlStrEqual(step.ns, ns)))
	{
	    match = 1;
	}
	final = step.flags & XML_STREAM_STEP_FINAL;
	if (match) {
	    if (final) {
		ret = 1;
            } else if (xmlStreamCtxtAddState(stream, 1, stream->level) < 0) {
                return(-1);
            }
	    if ((ret != 1) && (step.flags & XML_STREAM_STEP_IN_SET)) {
		/*
		* Check if we have a special case like "foo//.", where
		* "foo" is selected as well.
		*/
		ret = 1;
	    }
	}
	if (((comp->flags & XML_STREAM_DESC) == 0) &&
	    ((! match) || final))  {
	    /*
	    * Mark this expression as blocked for any evaluation at
	    * deeper levels.
	    */
	    stream->blockLevel = stream->level;
	}

stream_next:
        stream = stream->next;
    } /* while stream != NULL */

    return(ret);
}